

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall
QuantizeData::threshold_distribution
          (QuantizeData *this,vector<float,_std::allocator<float>_> *distribution,int target_bin)

{
  pointer pfVar1;
  pointer pfVar2;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  undefined8 uVar3;
  long lVar4;
  int j;
  size_type sVar5;
  pointer pfVar6;
  long lVar7;
  long lVar8;
  QuantizeData *this_00;
  ulong uVar9;
  size_type sVar10;
  int iVar11;
  int i;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar19;
  vector<float,_std::allocator<float>_> quantize_distribution;
  vector<float,_std::allocator<float>_> expand_distribution;
  vector<float,_std::allocator<float>_> t_distribution;
  float local_f4;
  allocator_type local_ed;
  float local_ec;
  int local_e8;
  float local_e4;
  float local_e0;
  value_type_conflict local_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  vector<float,_std::allocator<float>_> *local_c0;
  long local_b8;
  size_type local_b0;
  pointer local_a8;
  _Vector_base<float,_std::allocator<float>_> local_a0;
  undefined1 local_88 [24];
  _Vector_base<float,_std::allocator<float>_> local_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pfVar1 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar10 = (size_type)target_bin;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_a0,sVar10,(allocator_type *)&local_70);
  local_b8 = (long)(int)((ulong)((long)pfVar1 - (long)pfVar2) >> 2);
  local_f4 = 0.0;
  for (sVar5 = sVar10; (long)sVar5 < local_b8; sVar5 = sVar5 + 1) {
    local_f4 = local_f4 +
               (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start[sVar5];
  }
  local_ec = (float)target_bin;
  uVar9 = 0;
  if (0 < target_bin) {
    uVar9 = (ulong)(uint)target_bin;
  }
  fVar14 = 1000.0;
  local_c0 = distribution;
  for (; (long)sVar10 < local_b8; sVar10 = sVar10 + 1) {
    __first._M_current =
         (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_e4 = fVar14;
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)&local_70,__first,
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               (__first._M_current + sVar10),(allocator_type *)local_88);
    pfVar2 = local_a0._M_impl.super__Vector_impl_data._M_start;
    *(float *)((long)local_70._M_impl.super__Vector_impl_data._M_start + -4 + sVar10 * 4) =
         *(float *)((long)local_70._M_impl.super__Vector_impl_data._M_start + -4 + sVar10 * 4) +
         local_f4;
    pfVar1 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_d8 = pfVar1[sVar10];
    for (pfVar6 = local_a0._M_impl.super__Vector_impl_data._M_start;
        pfVar6 != local_a0._M_impl.super__Vector_impl_data._M_finish; pfVar6 = pfVar6 + 1) {
      *pfVar6 = 0.0;
    }
    fVar14 = (float)(int)sVar10 / local_ec;
    local_e8 = target_bin;
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      fVar15 = (float)(int)uVar12 * fVar14;
      fVar16 = ceilf(fVar15);
      if (fVar15 < (float)(int)fVar16) {
        pfVar2[uVar12] =
             ((float)(int)fVar16 - fVar15) * pfVar1[(long)(int)fVar16 + -1] + pfVar2[uVar12];
      }
      fVar15 = fVar15 + fVar14;
      fVar17 = floorf(fVar15);
      if ((float)(int)fVar17 < fVar15) {
        pfVar2[uVar12] = (fVar15 - (float)(int)fVar17) * pfVar1[(int)fVar17] + pfVar2[uVar12];
      }
      for (lVar7 = (long)(int)fVar16; lVar7 < (int)fVar17; lVar7 = lVar7 + 1) {
        pfVar2[uVar12] = pfVar1[lVar7] + pfVar2[uVar12];
      }
    }
    local_dc = 0.0;
    this_00 = (QuantizeData *)local_88;
    local_b0 = sVar10;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this_00,sVar10,&local_dc,&local_ed);
    uVar3 = local_88._0_8_;
    distribution = local_c0;
    local_f4 = local_f4 - local_d8;
    pfVar1 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = local_a0._M_impl.super__Vector_impl_data._M_start;
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      fVar15 = (float)(int)uVar12 * fVar14;
      fVar16 = ceilf(fVar15);
      iVar11 = (int)fVar16;
      local_d8 = (float)(int)fVar16;
      fStack_d4 = (float)(int)extraout_XMM0_Db;
      fStack_d0 = (float)(int)extraout_XMM0_Dc;
      fStack_cc = (float)(int)extraout_XMM0_Dd;
      local_48 = 0.0;
      fStack_44 = 0.0;
      fStack_40 = 0.0;
      fStack_3c = 0.0;
      local_58 = 0.0;
      fStack_54 = 0.0;
      fStack_50 = 0.0;
      fStack_4c = 0.0;
      if (fVar15 < local_d8) {
        local_48 = local_d8 - fVar15;
        fStack_44 = fStack_d4;
        fStack_40 = fStack_d0;
        fStack_3c = fStack_cc;
        if ((pfVar1[(long)iVar11 + -1] != 0.0) || (NAN(pfVar1[(long)iVar11 + -1]))) {
          local_58 = local_48;
          fStack_54 = fStack_d4;
          fStack_50 = fStack_d0;
          fStack_4c = fStack_cc;
        }
      }
      local_e0 = fVar14 + fVar15;
      fVar17 = floorf(local_e0);
      fVar19 = (float)(int)fVar17;
      fVar16 = local_58;
      if (local_e0 <= fVar19) {
        fVar18 = 0.0;
      }
      else {
        fVar18 = local_e0 - fVar19;
        if ((pfVar1[(int)fVar17] != 0.0) || (NAN(pfVar1[(int)fVar17]))) {
          fVar16 = local_58 + fVar18;
        }
      }
      lVar4 = (long)(int)fVar17;
      lVar8 = (long)iVar11;
      for (lVar7 = lVar8; lVar7 < lVar4; lVar7 = lVar7 + 1) {
        uVar13 = -(uint)((distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar7] != 0.0);
        fVar16 = (float)(~uVar13 & (uint)fVar16 | (uint)(fVar16 + 1.0) & uVar13);
      }
      fVar16 = local_a8[uVar12] / fVar16;
      if (fVar15 < local_d8) {
        if ((pfVar1[(long)iVar11 + -1] != 0.0) || (NAN(pfVar1[(long)iVar11 + -1]))) {
          lVar7 = (long)iVar11 + -1;
          *(float *)(uVar3 + lVar7 * 4) = local_48 * fVar16 + *(float *)(uVar3 + lVar7 * 4);
        }
      }
      if ((fVar19 < local_e0) && ((pfVar1[lVar4] != 0.0 || (NAN(pfVar1[lVar4]))))) {
        *(float *)(uVar3 + lVar4 * 4) = fVar18 * fVar16 + *(float *)(uVar3 + lVar4 * 4);
      }
      pfVar2 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (; lVar8 < lVar4; lVar8 = lVar8 + 1) {
        fVar15 = pfVar2[lVar8];
        if ((fVar15 != 0.0) || (NAN(fVar15))) {
          *(float *)(local_88._0_8_ + lVar8 * 4) = *(float *)(local_88._0_8_ + lVar8 * 4) + fVar16;
        }
      }
    }
    fVar15 = compute_kl_divergence
                       (this_00,(vector<float,_std::allocator<float>_> *)&local_70,
                        (vector<float,_std::allocator<float>_> *)local_88);
    sVar10 = local_b0;
    fVar14 = fVar15;
    if (local_e4 <= fVar15) {
      fVar14 = local_e4;
    }
    target_bin = local_e8;
    if (fVar15 < local_e4) {
      target_bin = (int)local_b0;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)local_88);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_a0);
  return target_bin;
}

Assistant:

int QuantizeData::threshold_distribution(const std::vector<float> &distribution, const int target_bin) 
{
    int target_threshold = target_bin;
    float min_kl_divergence = 1000;
    const int length = distribution.size();

    std::vector<float> quantize_distribution(target_bin);

    float threshold_sum = 0;
    for (int threshold=target_bin; threshold<length; threshold++) 
    {
        threshold_sum += distribution[threshold];
    }

    for (int threshold=target_bin; threshold<length; threshold++) 
    {

        std::vector<float> t_distribution(distribution.begin(), distribution.begin()+threshold);
        
        t_distribution[threshold-1] += threshold_sum; 
        threshold_sum -= distribution[threshold];

        // get P
        fill(quantize_distribution.begin(), quantize_distribution.end(), 0);
        
        const float num_per_bin = static_cast<float>(threshold) / target_bin;

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            const int left_upper = ceil(start);
            if (left_upper > start) 
            {
                const float left_scale = left_upper - start;
                quantize_distribution[i] += left_scale * distribution[left_upper - 1];
            }

            const int right_lower = floor(end);

            if (right_lower < end) 
            {

                const float right_scale = end - right_lower;
                quantize_distribution[i] += right_scale * distribution[right_lower];
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                quantize_distribution[i] += distribution[j];
            }
        }

        // get Q
        std::vector<float> expand_distribution(threshold, 0);

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            float count = 0;

            const int left_upper = ceil(start);
            float left_scale = 0;
            if (left_upper > start) 
            {
                left_scale = left_upper - start;
                if (distribution[left_upper - 1] != 0) 
                {
                    count += left_scale;
                }
            }

            const int right_lower = floor(end);
            float right_scale = 0;
            if (right_lower < end) 
            {
                right_scale = end - right_lower;
                if (distribution[right_lower] != 0) 
                {
                    count += right_scale;
                }
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    count++;
                }
            }

            const float expand_value = quantize_distribution[i] / count;

            if (left_upper > start) 
            {
                if (distribution[left_upper - 1] != 0) 
                {
                    expand_distribution[left_upper - 1] += expand_value * left_scale;
                }
            }
            if (right_lower < end) 
            {
                if (distribution[right_lower] != 0) 
                {
                    expand_distribution[right_lower] += expand_value * right_scale;
                }
            }
            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    expand_distribution[j] += expand_value;
                }
            }
        }

        // kl
        float kl_divergence = compute_kl_divergence(t_distribution, expand_distribution);

        // the best num of bin
        if (kl_divergence < min_kl_divergence) 
        {
            min_kl_divergence = kl_divergence;
            target_threshold = threshold;
        }
    }

    return target_threshold;
}